

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

double EDCircles::ComputeEllipseError(EllipseEquation *eq,double *px,double *py,int noPoints)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double yc;
  double xc;
  double minor;
  double major;
  double local_88;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  double local_20;
  
  dVar10 = eq->coeff[1];
  dVar1 = eq->coeff[2];
  local_78 = eq->coeff[3];
  uStack_70 = 0;
  dVar2 = eq->coeff[4];
  dVar3 = eq->coeff[5];
  dVar4 = eq->coeff[6];
  ComputeEllipseCenterAndAxisLengths(eq,&local_80,&local_88,&local_20,&local_28);
  dVar9 = 0.0;
  if (0 < noPoints) {
    local_38 = dVar10 + dVar10;
    uStack_30 = 0;
    dVar14 = local_78 + local_78;
    local_48 = local_78;
    dVar9 = 0.0;
    uVar8 = 0;
    do {
      dVar5 = px[uVar8];
      dVar11 = dVar5 - local_80;
      dVar6 = py[uVar8];
      dVar22 = dVar6 - local_88;
      if (ABS(dVar11) <= ABS(dVar22)) {
        dVar11 = dVar11 / dVar22;
        dVar12 = local_80 - dVar11 * local_88;
        dVar15 = dVar2 * dVar11 + local_38 * dVar11 * dVar12 + dVar1 * dVar12 + dVar3;
        dVar23 = dVar10 * dVar11 * dVar11 + dVar1 * dVar11 + local_78;
        dVar22 = dVar15 * dVar15 +
                 (dVar10 * dVar12 * dVar12 + dVar2 * dVar12 + dVar4) * dVar23 * -4.0;
        dVar13 = 0.0;
        if (0.0 <= dVar22) {
          dVar13 = dVar22;
        }
        auVar20._0_8_ = -(dVar15 + SQRT(dVar13));
        auVar20._8_8_ = -(dVar15 - SQRT(dVar13));
        auVar25._8_8_ = dVar23 + dVar23;
        auVar25._0_8_ = dVar23 + dVar23;
        auVar25 = divpd(auVar20,auVar25);
        dVar22 = dVar11 * auVar25._0_8_ + dVar12;
        dVar12 = dVar11 * auVar25._8_8_ + dVar12;
        dVar15 = dVar5 - dVar22;
        dVar11 = dVar6 - auVar25._0_8_;
        dVar13 = dVar6 - auVar25._8_8_;
        dVar11 = dVar15 * dVar15 + dVar11 * dVar11;
        dVar13 = (dVar5 - dVar12) * (dVar5 - dVar12) + dVar13 * dVar13;
        auVar21._0_8_ = -(ulong)(dVar11 < dVar13) & (ulong)dVar22;
        auVar21._8_8_ = (ulong)dVar13 & (ulong)dVar12;
        auVar19._0_8_ = ~-(ulong)(dVar11 < dVar13) & (ulong)dVar12;
        auVar19._8_8_ = ~(ulong)dVar13 & (ulong)dVar12;
        auVar18 = auVar19 | auVar21;
        if (dVar13 <= dVar11) {
          dVar11 = dVar13;
        }
      }
      else {
        dVar22 = dVar22 / dVar11;
        dVar12 = local_88 - dVar22 * local_80;
        dVar15 = local_78 * dVar22 * dVar22 + dVar1 * dVar22 + dVar10;
        dVar23 = dVar3 * dVar22 + dVar1 * dVar12 + dVar14 * dVar22 * dVar12 + dVar2;
        dVar11 = dVar23 * dVar23 +
                 dVar15 * -4.0 * (local_78 * dVar12 * dVar12 + dVar3 * dVar12 + dVar4);
        dVar13 = 0.0;
        if (0.0 <= dVar11) {
          dVar13 = dVar11;
        }
        auVar16._0_8_ = dVar15 + dVar15;
        auVar24._0_8_ = -(dVar23 + SQRT(dVar13));
        auVar24._8_8_ = -(dVar23 - SQRT(dVar13));
        auVar16._8_8_ = auVar16._0_8_;
        auVar25 = divpd(auVar24,auVar16);
        dVar13 = auVar25._0_8_;
        dVar15 = auVar25._8_8_;
        dVar11 = dVar6 - (dVar22 * dVar13 + dVar12);
        dVar22 = dVar6 - (dVar22 * dVar15 + dVar12);
        dVar11 = (dVar5 - dVar13) * (dVar5 - dVar13) + dVar11 * dVar11;
        dVar22 = (dVar5 - dVar15) * (dVar5 - dVar15) + dVar22 * dVar22;
        auVar17._0_8_ = ~-(ulong)(dVar11 < dVar22) & (ulong)dVar15;
        auVar17._8_8_ = ~(ulong)dVar22 & (ulong)dVar15;
        auVar7._8_4_ = (int)((ulong)dVar22 & (ulong)dVar15);
        auVar7._0_8_ = -(ulong)(dVar11 < dVar22) & (ulong)dVar13;
        auVar7._12_4_ = (int)(((ulong)dVar22 & (ulong)dVar15) >> 0x20);
        auVar18 = auVar17 | auVar7;
        if (dVar22 <= dVar11) {
          dVar11 = dVar22;
        }
      }
      dVar22 = auVar18._0_8_;
      do {
        dVar13 = dVar11;
        dVar22 = dVar22 + 0.5;
        dVar15 = dVar1 * dVar22 + dVar3;
        dVar11 = dVar15 * dVar15 +
                 (dVar10 * dVar22 * dVar22 + dVar2 * dVar22 + dVar4) * local_78 * -4.0;
        dVar12 = 0.0;
        if (0.0 <= dVar11) {
          dVar12 = dVar11;
        }
        dVar11 = (dVar15 + SQRT(dVar12)) / dVar14 + dVar6;
        dVar23 = (dVar5 - dVar22) * (dVar5 - dVar22);
        dVar11 = dVar11 * dVar11 + dVar23;
      } while ((dVar11 <= dVar13) ||
              (dVar11 = (dVar15 - SQRT(dVar12)) / dVar14 + dVar6, dVar11 = dVar23 + dVar11 * dVar11,
              dVar11 <= dVar13));
      do {
        dVar12 = dVar13;
        auVar18._0_8_ = auVar18._0_8_ + -0.5;
        dVar15 = dVar1 * auVar18._0_8_ + dVar3;
        dVar11 = dVar15 * dVar15 +
                 (dVar10 * auVar18._0_8_ * auVar18._0_8_ + dVar2 * auVar18._0_8_ + dVar4) *
                 local_78 * -4.0;
        dVar22 = 0.0;
        if (0.0 <= dVar11) {
          dVar22 = dVar11;
        }
        dVar13 = (dVar15 + SQRT(dVar22)) / dVar14 + dVar6;
        dVar11 = (dVar5 - auVar18._0_8_) * (dVar5 - auVar18._0_8_);
        dVar13 = dVar13 * dVar13 + dVar11;
      } while ((dVar13 <= dVar12) ||
              (dVar22 = (dVar15 - SQRT(dVar22)) / dVar14 + dVar6, dVar13 = dVar11 + dVar22 * dVar22,
              dVar13 <= dVar12));
      dVar9 = dVar9 + dVar12;
      uVar8 = uVar8 + 1;
      local_68 = dVar1;
      dStack_60 = dVar2;
      local_58 = dVar10;
      dStack_50 = dVar10;
      dStack_40 = dVar4;
    } while (uVar8 != (uint)noPoints);
  }
  dVar9 = dVar9 / (double)noPoints;
  if (dVar9 < 0.0) {
    dVar10 = sqrt(dVar9);
    return dVar10;
  }
  return SQRT(dVar9);
}

Assistant:

double EDCircles::ComputeEllipseError(EllipseEquation * eq, double * px, double * py, int noPoints)
{
	double error = 0;

	double A = eq->A();
	double B = eq->B();
	double C = eq->C();
	double D = eq->D();
	double E = eq->E();
	double F = eq->F();

	double xc, yc, major, minor;
	ComputeEllipseCenterAndAxisLengths(eq, &xc, &yc, &major, &minor);

	for (int i = 0; i<noPoints; i++) {
		double dx = px[i] - xc;
		double dy = py[i] - yc;

		double min;
		double xs, ys;

		if (fabs(dx) > fabs(dy)) {
			// The line equation is of the form: y = mx+n
			double m = dy / dx;
			double n = yc - m*xc;

			// a*x^2 + b*x + c
			double a = A + B*m + C*m*m;
			double b = B*n + 2 * C*m*n + D + E*m;
			double c = C*n*n + E*n + F;
			double det = b*b - 4 * a*c;
			if (det<0) det = 0;
			double x1 = -(b + sqrt(det)) / (2 * a);
			double x2 = -(b - sqrt(det)) / (2 * a);

			double y1 = m*x1 + n;
			double y2 = m*x2 + n;

			dx = px[i] - x1;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dx = px[i] - x2;
			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1<d2) { min = d1; xs = x1; ys = y1; }
			else { min = d2; xs = x2; ys = y2; }

		}
		else {
			// The line equation is of the form: x = my+n
			double m = dx / dy;
			double n = xc - m*yc;

			// a*y^2 + b*y + c
			double a = A*m*m + B*m + C;
			double b = 2 * A*m*n + B*n + D*m + E;
			double c = A*n*n + D*n + F;
			double det = b*b - 4 * a*c;
			if (det<0) det = 0;
			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			double x1 = m*y1 + n;
			double x2 = m*y2 + n;

			dx = px[i] - x1;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dx = px[i] - x2;
			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1<d2) { min = d1; xs = x1; ys = y1; }
			else { min = d2; xs = x2; ys = y2; }
		} //end-else

		  // Refine the search in the vicinity of (xs, ys)
		double delta = 0.5;
		double x = xs;
		while (1) {
			x += delta;

			double a = C;
			double b = B*x + E;
			double c = A*x*x + D*x + F;
			double det = b*b - 4 * a*c;
			if (det < 0) det = 0;

			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			dx = px[i] - x;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1 <= min) { min = d1; }
			else if (d2 <= min) { min = d2; }
			else break;
		} //end-while

		x = xs;
		while (1) {
			x -= delta;

			double a = C;
			double b = B*x + E;
			double c = A*x*x + D*x + F;
			double det = b*b - 4 * a*c;
			if (det < 0) det = 0;

			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			dx = px[i] - x;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1 <= min) { min = d1; }
			else if (d2 <= min) { min = d2; }
			else break;
		} //end-while

		error += min;
	} //end-for

	error = sqrt(error / noPoints);

	return error;
}